

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::ParsePartialFromZeroCopyStream
          (MessageLite *this,ZeroCopyInputStream *input)

{
  int iVar1;
  byte bVar2;
  CodedInputStream decoder;
  CodedInputStream local_58;
  
  local_58.buffer_ = (uint8 *)0x0;
  local_58.buffer_end_ = (uint8 *)0x0;
  local_58._24_6_ = 0;
  local_58.overflow_bytes_._2_2_ = 0;
  local_58.last_tag_ = 0;
  local_58.legitimate_message_end_ = false;
  local_58.aliasing_enabled_ = false;
  local_58.current_limit_ = 0x7fffffff;
  local_58.buffer_size_after_limit_ = 0;
  local_58.total_bytes_limit_ = 0x7fffffff;
  local_58.recursion_budget_ = io::CodedInputStream::default_recursion_limit_;
  local_58.recursion_limit_ = io::CodedInputStream::default_recursion_limit_;
  local_58.disable_strict_correctness_enforcement_ = true;
  local_58.extension_pool_ = (DescriptorPool *)0x0;
  local_58.extension_factory_ = (MessageFactory *)0x0;
  local_58.input_ = input;
  io::CodedInputStream::Refresh(&local_58);
  (*this->_vptr_MessageLite[7])(this);
  iVar1 = (*this->_vptr_MessageLite[0xb])(this,&local_58);
  bVar2 = (byte)iVar1 & local_58.legitimate_message_end_;
  io::CodedInputStream::~CodedInputStream(&local_58);
  return (bool)bVar2;
}

Assistant:

bool MessageLite::ParsePartialFromZeroCopyStream(
    io::ZeroCopyInputStream* input) {
  io::CodedInputStream decoder(input);
  return ParsePartialFromCodedStream(&decoder) &&
         decoder.ConsumedEntireMessage();
}